

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O0

void __thiscall ipx::SparseMatrix::resize(SparseMatrix *this,Int nrow,Int ncol,Int min_capacity)

{
  iterator __first;
  iterator __last;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  
  *(undefined4 *)
   &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
       = in_ESI;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_EDX),
             CONCAT44(in_ECX,in_stack_ffffffffffffffe8));
  std::vector<int,_std::allocator<int>_>::shrink_to_fit
            ((vector<int,_std::allocator<int>_> *)0x84c844);
  __first = std::vector<int,_std::allocator<int>_>::begin(in_RDI);
  __last = std::vector<int,_std::allocator<int>_>::end(in_RDI);
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,
             (int *)(ulong)in_stack_ffffffffffffffd0);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_EDX),
             CONCAT44(in_ECX,in_stack_ffffffffffffffe8));
  std::vector<int,_std::allocator<int>_>::shrink_to_fit
            ((vector<int,_std::allocator<int>_> *)0x84c8a3);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_ESI,in_EDX),
             CONCAT44(in_ECX,in_stack_ffffffffffffffe8));
  std::vector<double,_std::allocator<double>_>::shrink_to_fit
            ((vector<double,_std::allocator<double>_> *)0x84c8c2);
  return;
}

Assistant:

void SparseMatrix::resize(Int nrow, Int ncol, Int min_capacity) {
    assert(nrow >= 0);
    assert(ncol >= 0);
    assert(min_capacity >= 0);
    nrow_ = nrow;
    colptr_.resize(ncol+1);
    colptr_.shrink_to_fit();
    std::fill(colptr_.begin(), colptr_.end(), 0);
    rowidx_.resize(min_capacity);
    rowidx_.shrink_to_fit();
    values_.resize(min_capacity);
    values_.shrink_to_fit();
}